

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall mkvparser::Cluster::GetEntry(Cluster *this,long index,BlockEntry **pEntry)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  BlockEntry *pBVar4;
  long lStack_10;
  
  lVar1 = this->m_element_start;
  lVar2 = this->m_pos;
  if (lVar2 < lVar1) {
    __assert_fail("m_pos >= m_element_start",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1a68,
                  "long mkvparser::Cluster::GetEntry(long, const mkvparser::BlockEntry *&) const");
  }
  *pEntry = (BlockEntry *)0x0;
  if (index < 0) {
    lStack_10 = -1;
  }
  else {
    uVar3 = this->m_entries_count;
    lStack_10 = -3;
    if (-1 < (long)uVar3) {
      if (this->m_entries == (BlockEntry **)0x0) {
        __assert_fail("m_entries",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1a72,
                      "long mkvparser::Cluster::GetEntry(long, const mkvparser::BlockEntry *&) const"
                     );
      }
      if (this->m_entries_size < 1) {
        __assert_fail("m_entries_size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1a73,
                      "long mkvparser::Cluster::GetEntry(long, const mkvparser::BlockEntry *&) const"
                     );
      }
      if ((ulong)this->m_entries_size < uVar3) {
        __assert_fail("m_entries_count <= m_entries_size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1a74,
                      "long mkvparser::Cluster::GetEntry(long, const mkvparser::BlockEntry *&) const"
                     );
      }
      if ((ulong)index < uVar3) {
        pBVar4 = this->m_entries[index];
        *pEntry = pBVar4;
        if (pBVar4 == (BlockEntry *)0x0) {
          __assert_fail("pEntry",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1a78,
                        "long mkvparser::Cluster::GetEntry(long, const mkvparser::BlockEntry *&) const"
                       );
        }
        lStack_10 = 1;
      }
      else if (-1 < this->m_element_size) {
        lStack_10 = (ulong)(this->m_element_size + lVar1 <= lVar2) * 3 + -3;
      }
    }
  }
  return lStack_10;
}

Assistant:

long Cluster::GetEntry(long index, const mkvparser::BlockEntry*& pEntry) const {
  assert(m_pos >= m_element_start);

  pEntry = NULL;

  if (index < 0)
    return -1;  // generic error

  if (m_entries_count < 0)
    return E_BUFFER_NOT_FULL;

  assert(m_entries);
  assert(m_entries_size > 0);
  assert(m_entries_count <= m_entries_size);

  if (index < m_entries_count) {
    pEntry = m_entries[index];
    assert(pEntry);

    return 1;  // found entry
  }

  if (m_element_size < 0)  // we don't know cluster end yet
    return E_BUFFER_NOT_FULL;  // underflow

  const long long element_stop = m_element_start + m_element_size;

  if (m_pos >= element_stop)
    return 0;  // nothing left to parse

  return E_BUFFER_NOT_FULL;  // underflow, since more remains to be parsed
}